

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::checkRank(Result *__return_storage_ptr__,NeuralNetworkLayer *layer,
                          string *layerType,int min,int max,string *blobType,int rank)

{
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (-1 < max && max < min) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0x27,
                  "Result CoreML::checkRank(const Specification::NeuralNetworkLayer &, const std::string &, int, int, const std::string &, int)"
                 );
  }
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  if (((max < 1) || (max != min)) || (rank == max)) {
    if (rank < min && 0 < min) {
      std::operator+(&local_190,"Layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&local_170,&local_190,"\' of type \'");
      std::operator+(&local_150,&local_170,layerType);
      std::operator+(&local_130,&local_150,"\' has ");
      std::operator+(&local_110,&local_130,blobType);
      std::operator+(&local_f0,&local_110," rank ");
      std::__cxx11::to_string(&local_1b0,rank);
      std::operator+(&local_d0,&local_f0,&local_1b0);
      std::operator+(&local_b0,&local_d0," but expects rank at least ");
      std::__cxx11::to_string(&local_1d0,min);
      std::operator+(&local_90,&local_b0,&local_1d0);
      std::operator+(&local_50,&local_90,".");
    }
    else {
      if (rank <= max || max < 1) {
        Result::Result(__return_storage_ptr__);
        goto LAB_002b5360;
      }
      std::operator+(&local_190,"Layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&local_170,&local_190,"\' of type \'");
      std::operator+(&local_150,&local_170,layerType);
      std::operator+(&local_130,&local_150,"\' has ");
      std::operator+(&local_110,&local_130,blobType);
      std::operator+(&local_f0,&local_110," rank ");
      std::__cxx11::to_string(&local_1b0,rank);
      std::operator+(&local_d0,&local_f0,&local_1b0);
      std::operator+(&local_b0,&local_d0," but expects rank at most ");
      std::__cxx11::to_string(&local_1d0,max);
      std::operator+(&local_90,&local_b0,&local_1d0);
      std::operator+(&local_50,&local_90,".");
    }
  }
  else {
    std::operator+(&local_190,"Layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_170,&local_190,"\' of type \'");
    std::operator+(&local_150,&local_170,layerType);
    std::operator+(&local_130,&local_150,"\' has ");
    std::operator+(&local_110,&local_130,blobType);
    std::operator+(&local_f0,&local_110," rank ");
    std::__cxx11::to_string(&local_1b0,rank);
    std::operator+(&local_d0,&local_f0,&local_1b0);
    std::operator+(&local_b0,&local_d0," but expects rank exactly ");
    std::__cxx11::to_string(&local_1d0,min);
    std::operator+(&local_90,&local_b0,&local_1d0);
    std::operator+(&local_50,&local_90,".");
  }
  std::__cxx11::string::operator=((string *)&err,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_002b5360:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

inline Result checkRank(const Specification::NeuralNetworkLayer& layer,
                        const std::string &layerType, int min, int max,
                        const std::string &blobType, int rank) {

    // blobType: "input" or "output"

    assert( min <= max || max < 0 );
    std::string err;

    if (max > 0 && max == min && rank != max) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + + "' has " + blobType  + " rank " + std::to_string(rank) + " but expects rank exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && rank < min) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + + "' has " + blobType + " rank " + std::to_string(rank) + " but expects rank at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && rank > max) {
        err = "Layer '" + layer.name() + "' of type '" + layerType + "' has " + blobType + " rank " + std::to_string(rank) + " but expects rank at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    } else {
        return Result();
    }
}